

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog_util.c
# Opt level: O1

int xclose(file_stream *strm)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (strm->is_standard_stream == false) {
    iVar1 = close(strm->fd);
    iVar2 = 0;
    if (iVar1 != 0) {
      msg_errno("Error closing %s",strm->name);
      iVar2 = -1;
    }
    free(strm->name);
  }
  if (strm->mmap_token == (void *)0x0) {
    free(strm->mmap_mem);
  }
  else {
    munmap(strm->mmap_mem,strm->mmap_size);
    strm->mmap_token = (void *)0x0;
  }
  strm->mmap_mem = (void *)0x0;
  strm->fd = -1;
  strm->name = (char *)0x0;
  return iVar2;
}

Assistant:

int
xclose(struct file_stream *strm)
{
	int ret = 0;

	if (!strm->is_standard_stream) {
		if (close(strm->fd) != 0) {
			msg_errno("Error closing %"TS, strm->name);
			ret = -1;
		}
		free(strm->name);
	}

	if (strm->mmap_token != NULL) {
#ifdef _WIN32
		UnmapViewOfFile(strm->mmap_mem);
		CloseHandle((HANDLE)strm->mmap_token);
#else
		munmap(strm->mmap_mem, strm->mmap_size);
#endif
		strm->mmap_token = NULL;
	} else {
		free(strm->mmap_mem);
	}
	strm->mmap_mem = NULL;
	strm->fd = -1;
	strm->name = NULL;
	return ret;
}